

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

double __thiscall
duckdb::QuantileSortTree::WindowScalar<duckdb::hugeint_t,double,false>
          (QuantileSortTree *this,QuantileCursor<duckdb::hugeint_t> *data,SubFrames *frames,idx_t n,
          Vector *result,QuantileValue *q)

{
  long lVar1;
  idx_t lidx;
  idx_t hidx;
  ulong n_00;
  ulong n_01;
  double dVar2;
  undefined1 auVar3 [16];
  Interpolator<false> interp;
  ID indirect;
  Interpolator<false> local_78;
  double local_48;
  double dStack_40;
  QuantileIndirect<duckdb::hugeint_t> local_38;
  
  unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>::
  operator->(&this->index_tree);
  duckdb::WindowMergeSortTree::Build();
  local_78.desc = false;
  lVar1 = n - 1;
  auVar3._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar3._0_8_ = lVar1;
  auVar3._12_4_ = 0x45300000;
  dStack_40 = auVar3._8_8_ - 1.9342813113834067e+25;
  local_78.RN = (dStack_40 + ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) *
                q->dbl;
  local_48 = local_78.RN;
  dVar2 = floor(local_78.RN);
  n_01 = (long)(dVar2 - 9.223372036854776e+18) & (long)dVar2 >> 0x3f | (long)dVar2;
  local_78.FRN = n_01;
  dVar2 = ceil(local_48);
  n_00 = (long)(dVar2 - 9.223372036854776e+18) & (long)dVar2 >> 0x3f | (long)dVar2;
  local_78.begin = 0;
  local_78.CRN = n_00;
  local_78.end = n;
  lidx = SelectNth(this,frames,n_01);
  hidx = lidx;
  if (n_01 != n_00) {
    hidx = SelectNth(this,frames,n_00);
  }
  local_38.data = data;
  dVar2 = Interpolator<false>::
          Interpolate<unsigned_long,double,duckdb::QuantileIndirect<duckdb::hugeint_t>>
                    (&local_78,lidx,hidx,result,&local_38);
  return dVar2;
}

Assistant:

RESULT_TYPE WindowScalar(QuantileCursor<INPUT_TYPE> &data, const SubFrames &frames, const idx_t n, Vector &result,
	                         const QuantileValue &q) {
		D_ASSERT(n > 0);

		//	Thread safe and idempotent.
		index_tree->Build();

		//	Find the interpolated indicies within the frame
		Interpolator<DISCRETE> interp(q, n, false);
		const auto lo_data = SelectNth(frames, interp.FRN);
		auto hi_data = lo_data;
		if (interp.CRN != interp.FRN) {
			hi_data = SelectNth(frames, interp.CRN);
		}

		//	Interpolate indirectly
		using ID = QuantileIndirect<INPUT_TYPE>;
		ID indirect(data);
		return interp.template Interpolate<idx_t, RESULT_TYPE, ID>(lo_data, hi_data, result, indirect);
	}